

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O1

void Cnf_DataPrint(Cnf_Dat_t *p,int fReadable)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  FILE *__stream;
  uint uVar4;
  uint *puVar5;
  long lVar6;
  
  __stream = _stdout;
  fprintf(_stdout,"p cnf %d %d\n",(ulong)(uint)p->nVars,(ulong)(uint)p->nClauses);
  if (0 < p->nClauses) {
    lVar6 = 0;
    do {
      puVar2 = (uint *)p->pClauses[lVar6 + 1];
      for (puVar5 = (uint *)p->pClauses[lVar6]; puVar5 < puVar2; puVar5 = puVar5 + 1) {
        uVar1 = *puVar5;
        uVar4 = (int)uVar1 >> 1;
        if (fReadable == 0) {
          uVar3 = ~uVar4;
          if ((uVar1 & 1) == 0) {
            uVar3 = uVar4 + 1;
          }
        }
        else {
          uVar3 = -uVar4;
          if ((uVar1 & 1) == 0) {
            uVar3 = uVar4;
          }
        }
        fprintf(__stream,"%d ",(ulong)uVar3);
      }
      lVar6 = lVar6 + 1;
      fputc(10,__stream);
    } while (lVar6 < p->nClauses);
  }
  fputc(10,__stream);
  return;
}

Assistant:

void Cnf_DataPrint( Cnf_Dat_t * p, int fReadable )
{
    FILE * pFile = stdout;
    int * pLit, * pStop, i;
    fprintf( pFile, "p cnf %d %d\n", p->nVars, p->nClauses );
    for ( i = 0; i < p->nClauses; i++ )
    {
        for ( pLit = p->pClauses[i], pStop = p->pClauses[i+1]; pLit < pStop; pLit++ )
            fprintf( pFile, "%d ", fReadable? Cnf_Lit2Var2(*pLit) : Cnf_Lit2Var(*pLit) );
        fprintf( pFile, "\n" );
    }
    fprintf( pFile, "\n" );
}